

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::interval_t,duckdb::dtime_tz_t,duckdb::dtime_tz_t,duckdb::BinaryStandardOperatorWrapper,duckdb::AddTimeOperator,bool,true,false>
               (interval_t *ldata,dtime_tz_t *rdata,dtime_tz_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  dtime_tz_t left;
  int64_t iVar2;
  dtime_tz_t dVar3;
  dtime_tz_t dVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  idx_t iVar8;
  ulong uVar9;
  interval_t right;
  interval_t right_00;
  interval_t right_01;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  ulong local_50;
  ulong local_48;
  ValidityMask *local_40;
  ulong local_38;
  
  local_48 = count;
  local_40 = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      dVar3.bits._0_4_ = ldata->months;
      dVar3.bits._4_4_ = ldata->days;
      iVar2 = ldata->micros;
      iVar8 = 0;
      do {
        local_54 = 0;
        right_01.micros = (int64_t)&local_54;
        right_01._0_8_ = iVar2;
        dVar4 = Interval::Add((Interval *)rdata[iVar8].bits,dVar3,right_01,(date_t *)mask);
        result_data[iVar8].bits = dVar4.bits;
        iVar8 = iVar8 + 1;
      } while (local_48 != iVar8);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_50 = count + 0x3f >> 6;
    local_38 = 0;
    uVar6 = 0;
    do {
      puVar1 = (local_40->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar5 = 0xffffffffffffffff;
      }
      else {
        uVar5 = puVar1[local_38];
      }
      uVar9 = uVar6 + 0x40;
      if (local_48 <= uVar6 + 0x40) {
        uVar9 = local_48;
      }
      uVar7 = uVar9;
      if (uVar5 != 0) {
        uVar7 = uVar6;
        if (uVar5 == 0xffffffffffffffff) {
          if (uVar6 < uVar9) {
            left.bits._0_4_ = ldata->months;
            left.bits._4_4_ = ldata->days;
            iVar2 = ldata->micros;
            do {
              local_5c = 0;
              right.micros = (int64_t)&local_5c;
              right._0_8_ = iVar2;
              dVar3 = Interval::Add((Interval *)rdata[uVar7].bits,left,right,(date_t *)mask);
              result_data[uVar7].bits = dVar3.bits;
              uVar7 = uVar7 + 1;
            } while (uVar9 != uVar7);
          }
        }
        else if (uVar6 < uVar9) {
          uVar7 = 0;
          do {
            if ((uVar5 >> (uVar7 & 0x3f) & 1) != 0) {
              dVar4.bits._0_4_ = ldata->months;
              dVar4.bits._4_4_ = ldata->days;
              local_58 = 0;
              right_00.micros = (int64_t)&local_58;
              right_00._0_8_ = ldata->micros;
              dVar3 = Interval::Add((Interval *)rdata[uVar6 + uVar7].bits,dVar4,right_00,
                                    (date_t *)mask);
              result_data[uVar6 + uVar7].bits = dVar3.bits;
            }
            uVar7 = uVar7 + 1;
          } while ((uVar6 - uVar9) + uVar7 != 0);
          uVar7 = uVar6 + uVar7;
        }
      }
      local_38 = local_38 + 1;
      uVar6 = uVar7;
    } while (local_38 != local_50);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}